

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_document_add_sequence
              (yaml_document_t *document,yaml_char_t *tag,yaml_sequence_style_t style)

{
  yaml_node_t **top;
  int iVar1;
  size_t length;
  yaml_char_t *__ptr;
  yaml_node_item_t *__ptr_00;
  yaml_node_t *pyVar2;
  int iVar3;
  char *start;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x4ec,
                  "int yaml_document_add_sequence(yaml_document_t *, yaml_char_t *, yaml_sequence_style_t)"
                 );
  }
  start = "tag:yaml.org,2002:seq";
  if (tag != (yaml_char_t *)0x0) {
    start = (char *)tag;
  }
  length = strlen(start);
  iVar1 = yaml_check_utf8((yaml_char_t *)start,length);
  iVar3 = 0;
  if (iVar1 == 0) {
    return 0;
  }
  __ptr = (yaml_char_t *)strdup(start);
  if (__ptr == (yaml_char_t *)0x0) {
    return 0;
  }
  __ptr_00 = (yaml_node_item_t *)malloc(0x40);
  if (__ptr_00 == (yaml_node_item_t *)0x0) {
LAB_00104b5c:
    free(__ptr);
  }
  else {
    pyVar2 = (document->nodes).top;
    if (pyVar2 == (document->nodes).end) {
      top = &(document->nodes).top;
      iVar1 = yaml_stack_extend((void **)document,top,&(document->nodes).end);
      if (iVar1 == 0) {
        free(__ptr_00);
        goto LAB_00104b5c;
      }
      pyVar2 = *top;
    }
    (document->nodes).top = pyVar2 + 1;
    *(undefined8 *)pyVar2 = 2;
    pyVar2->tag = __ptr;
    (pyVar2->data).scalar.value = (yaml_char_t *)__ptr_00;
    (pyVar2->data).sequence.items.end = __ptr_00 + 0x10;
    (pyVar2->data).sequence.items.top = __ptr_00;
    (pyVar2->data).sequence.style = style;
    *(undefined8 *)((long)&pyVar2->data + 0x1c) = 0;
    *(undefined8 *)((long)&(pyVar2->start_mark).index + 4) = 0;
    *(undefined8 *)((long)&(pyVar2->start_mark).line + 4) = 0;
    *(undefined8 *)((long)&(pyVar2->start_mark).column + 4) = 0;
    *(undefined8 *)((long)&(pyVar2->end_mark).index + 4) = 0;
    *(undefined8 *)((long)&(pyVar2->end_mark).line + 4) = 0;
    *(undefined4 *)((long)&(pyVar2->end_mark).column + 4) = 0;
    iVar3 = (int)((ulong)((long)(document->nodes).top - (long)(document->nodes).start) >> 5) *
            -0x55555555;
  }
  return iVar3;
}

Assistant:

YAML_DECLARE(int)
yaml_document_add_sequence(yaml_document_t *document,
        yaml_char_t *tag, yaml_sequence_style_t style)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *tag_copy = NULL;
    struct {
        yaml_node_item_t *start;
        yaml_node_item_t *end;
        yaml_node_item_t *top;
    } items = { NULL, NULL, NULL };
    yaml_node_t node;

    assert(document);   /* Non-NULL document object is expected. */

    if (!tag) {
        tag = (yaml_char_t *)YAML_DEFAULT_SEQUENCE_TAG;
    }

    if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
    tag_copy = yaml_strdup(tag);
    if (!tag_copy) goto error;

    if (!STACK_INIT(&context, items, yaml_node_item_t*)) goto error;

    SEQUENCE_NODE_INIT(node, tag_copy, items.start, items.end,
            style, mark, mark);
    if (!PUSH(&context, document->nodes, node)) goto error;

    return document->nodes.top - document->nodes.start;

error:
    STACK_DEL(&context, items);
    yaml_free(tag_copy);

    return 0;
}